

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac *pFlac,ma_uint64 framesToRead,float *pBufferOut)

{
  ma_uint32 *pmVar1;
  int *piVar2;
  int *piVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  byte bVar6;
  ma_uint8 mVar7;
  byte bVar8;
  ma_int32 *pmVar9;
  ma_int32 *pmVar10;
  uint uVar11;
  char cVar12;
  int iVar13;
  ma_bool32 mVar14;
  int iVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  uint uVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  uint uVar27;
  ulong uVar28;
  float *pfVar29;
  int iVar30;
  long lVar31;
  ulong uVar32;
  ulong uVar33;
  int iVar34;
  ma_uint64 mVar35;
  int iVar36;
  int iVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  int iVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  ma_uint32 *pInputSamples1U32;
  ma_uint32 *pInputSamples0U32;
  
  if (framesToRead != 0 && pFlac != (ma_dr_flac *)0x0) {
    if (pBufferOut == (float *)0x0) {
      mVar35 = ma_dr_flac__seek_forward_by_pcm_frames(pFlac,framesToRead);
      return mVar35;
    }
    if (framesToRead != 0) {
      bVar6 = pFlac->bitsPerSample;
      iVar36 = 0x20 - (uint)bVar6;
      iVar13 = 0x1f - (uint)bVar6;
      uVar19 = (uint)bVar6;
      iVar18 = 0x17 - uVar19;
      mVar35 = 0;
      do {
        uVar25 = (pFlac->currentFLACFrame).pcmFramesRemaining;
        uVar28 = (ulong)uVar25;
        if (uVar28 == 0) {
          mVar14 = ma_dr_flac__read_and_decode_next_flac_frame(pFlac);
          if (mVar14 == 0) {
            return mVar35;
          }
        }
        else {
          mVar7 = (pFlac->currentFLACFrame).header.channelAssignment;
          bVar8 = (&DAT_0017e9e0)[(char)mVar7];
          uVar32 = (ulong)((pFlac->currentFLACFrame).header.blockSizeInPCMFrames - uVar25);
          if (framesToRead < uVar28) {
            uVar28 = framesToRead;
          }
          cVar12 = (char)iVar36;
          uVar25 = (uint)uVar28;
          if ((0x702UL >> ((long)(char)mVar7 & 0x3fU) & 1) == 0) {
            uVar27 = 1;
            if (1 < bVar8) {
              uVar27 = (uint)bVar8;
            }
            lVar31 = 0;
            pfVar29 = pBufferOut;
            do {
              uVar33 = 0;
              do {
                *(float *)((long)pfVar29 + uVar33) =
                     (float)(*(int *)(lVar31 * 4 +
                                      *(long *)((long)&(pFlac->currentFLACFrame).subframes[0].
                                                       pSamplesS32 + uVar33 * 4) + uVar32 * 4) <<
                            ((&(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample)
                             [uVar33 * 4] + cVar12 & 0x1f)) * 4.656613e-10;
                uVar33 = uVar33 + 4;
              } while (uVar27 << 2 != uVar33);
              lVar31 = lVar31 + 1;
              pfVar29 = (float *)((long)pfVar29 + (ulong)((uint)bVar8 * 4));
            } while (lVar31 != uVar28 + (uVar28 == 0));
          }
          else {
            pmVar9 = (pFlac->currentFLACFrame).subframes[0].pSamplesS32;
            pmVar10 = (pFlac->currentFLACFrame).subframes[1].pSamplesS32;
            if (mVar7 == '\n') {
              if (((ma_dr_flac__gIsSSE2Supported & 1) == 0) || (0x18 < pFlac->bitsPerSample)) {
                if (uVar19 == 0x20) {
                  if (3 < uVar28) {
                    uVar22 = (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                    uVar27 = (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                    lVar31 = 0;
                    do {
                      uVar4 = *(undefined8 *)((long)pmVar9 + lVar31 + uVar32 * 4);
                      uVar5 = *(undefined8 *)((long)pmVar10 + lVar31 + uVar32 * 4);
                      uVar11 = (uint)((ulong)uVar5 >> 0x20);
                      uVar45 = (int)uVar5 << uVar22;
                      uVar46 = uVar45 & 1 | ((int)uVar4 << uVar27) * 2;
                      uVar47 = uVar11 & 1 | (int)((ulong)uVar4 >> 0x20) << 1;
                      pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                      *pfVar29 = (float)((int)(uVar46 + uVar45) >> 1) * 4.656613e-10;
                      pfVar29[1] = (float)((int)(uVar46 - uVar45) >> 1) * 4.656613e-10;
                      pfVar29[2] = (float)((int)(uVar47 + uVar11) >> 1) * 4.656613e-10;
                      pfVar29[3] = (float)((int)(uVar47 - uVar11) >> 1) * 4.656613e-10;
                      uVar4 = *(undefined8 *)((long)pmVar9 + lVar31 + uVar32 * 4 + 8);
                      uVar5 = *(undefined8 *)((long)pmVar10 + lVar31 + uVar32 * 4 + 8);
                      uVar11 = (uint)((ulong)uVar5 >> 0x20);
                      uVar45 = (int)uVar5 << uVar22;
                      uVar46 = uVar45 & 1 | ((int)uVar4 << uVar27) * 2;
                      uVar47 = uVar11 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                      pfVar29 = (float *)((long)pBufferOut + lVar31 * 2 + 0x10);
                      *pfVar29 = (float)((int)(uVar46 + uVar45) >> 1) * 4.656613e-10;
                      pfVar29[1] = (float)((int)(uVar46 - uVar45) >> 1) * 4.656613e-10;
                      pfVar29[2] = (float)((int)(uVar47 + uVar11) >> 1) * 4.656613e-10;
                      pfVar29[3] = (float)((int)(uVar47 - uVar11) >> 1) * 4.656613e-10;
                      lVar31 = lVar31 + 0x10;
                    } while ((uVar28 >> 2) * 0x10 != lVar31);
                  }
                }
                else if (3 < uVar28) {
                  uVar22 = (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  uVar27 = (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                  lVar31 = 0;
                  do {
                    uVar4 = *(undefined8 *)((long)pmVar9 + lVar31 + uVar32 * 4);
                    uVar5 = *(undefined8 *)((long)pmVar10 + lVar31 + uVar32 * 4);
                    uVar11 = (uint)((ulong)uVar5 >> 0x20);
                    uVar45 = (int)uVar5 << uVar22;
                    uVar46 = uVar45 & 1 | ((int)uVar4 << uVar27) * 2;
                    uVar47 = uVar11 & 1 | (int)((ulong)uVar4 >> 0x20) << 1;
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                    *pfVar29 = (float)(int)(uVar46 + uVar45 << iVar13) * 4.656613e-10;
                    pfVar29[1] = (float)(int)(uVar46 - uVar45) * 4.656613e-10;
                    pfVar29[2] = (float)(int)(uVar47 + uVar11) * 4.656613e-10;
                    pfVar29[3] = (float)(int)(uVar47 - uVar11) * 4.656613e-10;
                    uVar4 = *(undefined8 *)((long)pmVar9 + lVar31 + uVar32 * 4 + 8);
                    uVar5 = *(undefined8 *)((long)pmVar10 + lVar31 + uVar32 * 4 + 8);
                    uVar11 = (uint)((ulong)uVar5 >> 0x20);
                    uVar45 = (int)uVar5 << uVar22;
                    uVar46 = uVar45 & 1 | ((int)uVar4 << uVar27) * 2;
                    uVar47 = uVar11 & 1 | (int)((ulong)uVar4 >> 0x20) * 2;
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2 + 0x10);
                    *pfVar29 = (float)(int)(uVar46 + uVar45 << iVar13) * 4.656613e-10;
                    pfVar29[1] = (float)(int)(uVar46 - uVar45) * 4.656613e-10;
                    pfVar29[2] = (float)(int)(uVar47 + uVar11) * 4.656613e-10;
                    pfVar29[3] = (float)(int)(uVar47 - uVar11) * 4.656613e-10;
                    lVar31 = lVar31 + 0x10;
                  } while ((uVar28 >> 2) * 0x10 != lVar31);
                }
                uVar33 = (ulong)(uVar25 & 0xfffffffc);
                if (uVar33 != uVar28) {
                  bVar16 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                  bVar17 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  do {
                    uVar27 = pmVar10[uVar32 + uVar33] << (bVar17 & 0x1f);
                    iVar15 = (uVar27 & 1) + (pmVar9[uVar32 + uVar33] << (bVar16 & 0x1f)) * 2;
                    *(ulong *)(pBufferOut + uVar33 * 2) =
                         CONCAT44((float)((int)(iVar15 - uVar27) >> 1) * 4.656613e-10,
                                  (float)(((int)(iVar15 + uVar27) >> 1) << iVar36) * 4.656613e-10);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < uVar28);
                }
              }
              else if (bVar6 == 0x18) {
                if (3 < uVar28) {
                  lVar31 = 0;
                  do {
                    piVar2 = (int *)((long)pmVar9 + lVar31 + uVar32 * 4);
                    piVar3 = (int *)((long)pmVar10 + lVar31 + uVar32 * 4);
                    uVar27 = piVar3[1];
                    uVar22 = piVar3[2];
                    uVar11 = piVar3[3];
                    uVar45 = *piVar3 <<
                             (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                    uVar46 = uVar45 & 1 |
                             (*piVar2 <<
                             (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample) * 2;
                    uVar47 = uVar27 & 1 | piVar2[1] * 2;
                    uVar48 = uVar22 & 1 | piVar2[2] * 2;
                    uVar49 = uVar11 & 1 | piVar2[3] * 2;
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                    *pfVar29 = (float)((int)(uVar46 + uVar45) >> 1) * 1.1920929e-07;
                    pfVar29[1] = (float)((int)(uVar46 - uVar45) >> 1) * 1.1920929e-07;
                    pfVar29[2] = (float)((int)(uVar47 + uVar27) >> 1) * 1.1920929e-07;
                    pfVar29[3] = (float)((int)(uVar47 - uVar27) >> 1) * 1.1920929e-07;
                    auVar39._4_4_ = (float)((int)(uVar48 - uVar22) >> 1) * 1.1920929e-07;
                    auVar39._0_4_ = (float)((int)(uVar48 + uVar22) >> 1) * 1.1920929e-07;
                    auVar39._8_4_ = (float)((int)(uVar49 + uVar11) >> 1) * 1.1920929e-07;
                    auVar39._12_4_ = (float)((int)(uVar49 - uVar11) >> 1) * 1.1920929e-07;
                    *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar39;
                    lVar31 = lVar31 + 0x10;
                  } while ((uVar28 >> 2) * 0x10 != lVar31);
                }
                uVar33 = (ulong)(uVar25 & 0xfffffffc);
                if (uVar33 != uVar28) {
                  bVar16 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                  bVar17 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  do {
                    uVar27 = pmVar10[uVar32 + uVar33] << (bVar17 & 0x1f);
                    iVar15 = (uVar27 & 1) + (pmVar9[uVar32 + uVar33] << (bVar16 & 0x1f)) * 2;
                    *(ulong *)(pBufferOut + uVar33 * 2) =
                         CONCAT44((float)((int)(iVar15 - uVar27) >> 1) * 1.1920929e-07,
                                  (float)((int)(iVar15 + uVar27) >> 1) * 1.1920929e-07);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < uVar28);
                }
              }
              else {
                if (3 < uVar28) {
                  lVar31 = 0;
                  do {
                    piVar2 = (int *)((long)pmVar9 + lVar31 + uVar32 * 4);
                    piVar3 = (int *)((long)pmVar10 + lVar31 + uVar32 * 4);
                    uVar27 = piVar3[1];
                    uVar22 = piVar3[2];
                    uVar11 = piVar3[3];
                    uVar45 = *piVar3 <<
                             (uint)(pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                    uVar46 = uVar45 & 1 |
                             (*piVar2 <<
                             (uint)(pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample) * 2;
                    uVar47 = uVar27 & 1 | piVar2[1] * 2;
                    uVar48 = uVar22 & 1 | piVar2[2] * 2;
                    uVar49 = uVar11 & 1 | piVar2[3] * 2;
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                    *pfVar29 = (float)(int)(uVar46 + uVar45 << iVar18) * 1.1920929e-07;
                    pfVar29[1] = (float)(int)(uVar46 - uVar45 << iVar18) * 1.1920929e-07;
                    pfVar29[2] = (float)(int)(uVar47 + uVar27) * 1.1920929e-07;
                    pfVar29[3] = (float)(int)(uVar47 - uVar27) * 1.1920929e-07;
                    auVar43._4_4_ = (float)(int)(uVar48 - uVar22) * 1.1920929e-07;
                    auVar43._0_4_ = (float)(int)(uVar48 + uVar22) * 1.1920929e-07;
                    auVar43._8_4_ = (float)(int)(uVar49 + uVar11) * 1.1920929e-07;
                    auVar43._12_4_ = (float)(int)(uVar49 - uVar11) * 1.1920929e-07;
                    *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar43;
                    lVar31 = lVar31 + 0x10;
                  } while ((uVar28 >> 2) * 0x10 != lVar31);
                }
                uVar33 = (ulong)(uVar25 & 0xfffffffc);
                if (uVar33 != uVar28) {
                  bVar16 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample;
                  bVar17 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample;
                  do {
                    uVar27 = pmVar10[uVar32 + uVar33] << (bVar17 & 0x1f);
                    iVar15 = (uVar27 & 1) + (pmVar9[uVar32 + uVar33] << (bVar16 & 0x1f)) * 2;
                    *(ulong *)(pBufferOut + uVar33 * 2) =
                         CONCAT44((float)(int)(iVar15 - uVar27) * 1.1920929e-07,
                                  (float)(int)(iVar15 + uVar27 << iVar18) * 1.1920929e-07);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < uVar28);
                }
              }
            }
            else if (mVar7 == '\t') {
              if (((ma_dr_flac__gIsSSE2Supported & 1) == 0) || (0x18 < pFlac->bitsPerSample)) {
                bVar16 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample + cVar12;
                bVar17 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample + cVar12;
                if (3 < uVar28) {
                  lVar31 = 0;
                  do {
                    iVar15 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 4);
                    iVar20 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 8);
                    iVar26 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 0xc);
                    iVar24 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4) << (bVar17 & 0x1f);
                    iVar30 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 4) << (bVar17 & 0x1f);
                    iVar21 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 8) << (bVar17 & 0x1f);
                    iVar23 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 0xc) << (bVar17 & 0x1f);
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                    *pfVar29 = (float)((*(int *)((long)pmVar9 + lVar31 + uVar32 * 4) <<
                                       (bVar16 & 0x1f)) + iVar24) * 4.656613e-10;
                    pfVar29[1] = (float)iVar24 * 4.656613e-10;
                    pfVar29[2] = (float)((iVar15 << (bVar16 & 0x1f)) + iVar30) * 4.656613e-10;
                    pfVar29[3] = (float)iVar30 * 4.656613e-10;
                    auVar41._0_4_ = (float)((iVar20 << (bVar16 & 0x1f)) + iVar21) * 4.656613e-10;
                    auVar41._4_4_ = (float)iVar21 * 4.656613e-10;
                    auVar41._8_4_ = (float)((iVar26 << (bVar16 & 0x1f)) + iVar23) * 4.656613e-10;
                    auVar41._12_4_ = (float)iVar23 * 4.656613e-10;
                    *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar41;
                    lVar31 = lVar31 + 0x10;
                  } while ((uVar28 >> 2) << 4 != lVar31);
                }
                uVar33 = (ulong)(uVar25 & 0xfffffffc);
                if (uVar33 != uVar28) {
                  do {
                    iVar15 = pmVar10[uVar32 + uVar33] << (bVar17 & 0x1f);
                    *(ulong *)(pBufferOut + uVar33 * 2) =
                         CONCAT44((float)iVar15 * 4.656613e-10,
                                  (float)((pmVar9[uVar32 + uVar33] << (bVar16 & 0x1f)) + iVar15) *
                                  4.656613e-10);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < uVar28);
                }
              }
              else {
                iVar15 = ((pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample - uVar19) +
                         0x18;
                iVar20 = ((pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample - uVar19) +
                         0x18;
                if (3 < uVar28) {
                  lVar31 = 0;
                  do {
                    piVar2 = (int *)((long)pmVar9 + lVar31 + uVar32 * 4);
                    iVar26 = piVar2[1];
                    iVar21 = piVar2[2];
                    iVar23 = piVar2[3];
                    piVar3 = (int *)((long)pmVar10 + lVar31 + uVar32 * 4);
                    iVar24 = piVar3[1];
                    iVar30 = piVar3[2];
                    iVar34 = piVar3[3];
                    iVar44 = *piVar3 << iVar20;
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                    *pfVar29 = (float)((*piVar2 << iVar15) + iVar44) * 1.1920929e-07;
                    pfVar29[1] = (float)iVar44 * 1.1920929e-07;
                    pfVar29[2] = (float)(iVar26 + iVar24) * 1.1920929e-07;
                    pfVar29[3] = (float)iVar24 * 1.1920929e-07;
                    auVar38._4_4_ = (float)iVar30 * 1.1920929e-07;
                    auVar38._0_4_ = (float)(iVar21 + iVar30) * 1.1920929e-07;
                    auVar38._8_4_ = (float)(iVar23 + iVar34) * 1.1920929e-07;
                    auVar38._12_4_ = (float)iVar34 * 1.1920929e-07;
                    *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar38;
                    lVar31 = lVar31 + 0x10;
                  } while ((uVar28 >> 2) * 0x10 != lVar31);
                }
                uVar33 = (ulong)(uVar25 & 0xfffffffc);
                if (uVar33 != uVar28) {
                  do {
                    iVar26 = pmVar10[uVar32 + uVar33] << ((byte)iVar20 & 0x1f);
                    *(ulong *)(pBufferOut + uVar33 * 2) =
                         CONCAT44((float)iVar26 * 1.1920929e-07,
                                  (float)((pmVar9[uVar32 + uVar33] << ((byte)iVar15 & 0x1f)) +
                                         iVar26) * 1.1920929e-07);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < uVar28);
                }
              }
            }
            else if (mVar7 == '\b') {
              if (((ma_dr_flac__gIsSSE2Supported & 1) == 0) || (0x18 < pFlac->bitsPerSample)) {
                bVar16 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample + cVar12;
                bVar17 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample + cVar12;
                if (3 < uVar28) {
                  lVar31 = 0;
                  do {
                    iVar15 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4);
                    iVar20 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 4);
                    iVar26 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 8);
                    iVar21 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 0xc);
                    iVar34 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4) << (bVar16 & 0x1f);
                    iVar23 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 4) << (bVar16 & 0x1f);
                    iVar24 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 8) << (bVar16 & 0x1f);
                    iVar30 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 0xc) << (bVar16 & 0x1f);
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                    *pfVar29 = (float)iVar34 * 4.656613e-10;
                    pfVar29[1] = (float)(iVar34 - (iVar15 << (bVar17 & 0x1f))) * 4.656613e-10;
                    pfVar29[2] = (float)iVar23 * 4.656613e-10;
                    pfVar29[3] = (float)(iVar23 - (iVar20 << (bVar17 & 0x1f))) * 4.656613e-10;
                    auVar42._0_4_ = (float)iVar24 * 4.656613e-10;
                    auVar42._4_4_ = (float)(iVar24 - (iVar26 << (bVar17 & 0x1f))) * 4.656613e-10;
                    auVar42._8_4_ = (float)iVar30 * 4.656613e-10;
                    auVar42._12_4_ = (float)(iVar30 - (iVar21 << (bVar17 & 0x1f))) * 4.656613e-10;
                    *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar42;
                    lVar31 = lVar31 + 0x10;
                  } while ((uVar28 >> 2) << 4 != lVar31);
                }
                uVar33 = (ulong)(uVar25 & 0xfffffffc);
                if (uVar33 != uVar28) {
                  do {
                    iVar15 = pmVar9[uVar32 + uVar33] << (bVar16 & 0x1f);
                    *(ulong *)(pBufferOut + uVar33 * 2) =
                         CONCAT44((float)(iVar15 - (pmVar10[uVar32 + uVar33] << (bVar17 & 0x1f))) *
                                  4.656613e-10,(float)iVar15 * 4.656613e-10);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < uVar28);
                }
              }
              else {
                iVar15 = ((pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample - uVar19) +
                         0x18;
                iVar20 = ((pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample - uVar19) +
                         0x18;
                if (3 < uVar28) {
                  lVar31 = 0;
                  do {
                    piVar2 = (int *)((long)pmVar9 + lVar31 + uVar32 * 4);
                    iVar26 = piVar2[1];
                    iVar21 = piVar2[2];
                    iVar23 = piVar2[3];
                    iVar37 = *piVar2 << iVar15;
                    piVar2 = (int *)((long)pmVar10 + lVar31 + uVar32 * 4);
                    iVar24 = *piVar2;
                    iVar30 = piVar2[1];
                    iVar34 = piVar2[2];
                    iVar44 = piVar2[3];
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                    *pfVar29 = (float)iVar37 * 1.1920929e-07;
                    pfVar29[1] = (float)(iVar37 - (iVar24 << iVar20)) * 1.1920929e-07;
                    pfVar29[2] = (float)iVar26 * 1.1920929e-07;
                    pfVar29[3] = (float)(iVar26 - iVar30) * 1.1920929e-07;
                    pfVar29 = (float *)((long)pBufferOut + lVar31 * 2 + 0x10);
                    *pfVar29 = (float)iVar21 * 1.1920929e-07;
                    pfVar29[1] = (float)(iVar21 - iVar34) * 1.1920929e-07;
                    pfVar29[2] = (float)iVar23 * 1.1920929e-07;
                    pfVar29[3] = (float)(iVar23 - iVar44) * 1.1920929e-07;
                    lVar31 = lVar31 + 0x10;
                  } while ((uVar28 >> 2) * 0x10 != lVar31);
                }
                uVar33 = (ulong)(uVar25 & 0xfffffffc);
                if (uVar33 != uVar28) {
                  do {
                    iVar26 = pmVar9[uVar32 + uVar33] << ((byte)iVar15 & 0x1f);
                    *(ulong *)(pBufferOut + uVar33 * 2) =
                         CONCAT44((float)(iVar26 - (pmVar10[uVar32 + uVar33] <<
                                                   ((byte)iVar20 & 0x1f))) * 1.1920929e-07,
                                  (float)iVar26 * 1.1920929e-07);
                    uVar33 = uVar33 + 1;
                  } while (uVar33 < uVar28);
                }
              }
            }
            else if (((ma_dr_flac__gIsSSE2Supported & 1) == 0) || (0x18 < pFlac->bitsPerSample)) {
              bVar16 = (pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample + cVar12;
              bVar17 = (pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample + cVar12;
              if (3 < uVar28) {
                lVar31 = 0;
                do {
                  iVar15 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 4);
                  iVar20 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 8);
                  iVar26 = *(int *)((long)pmVar9 + lVar31 + uVar32 * 4 + 0xc);
                  iVar21 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4);
                  iVar23 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 4);
                  iVar24 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 8);
                  iVar30 = *(int *)((long)pmVar10 + lVar31 + uVar32 * 4 + 0xc);
                  *(float *)((long)pBufferOut + lVar31 * 2) =
                       (float)(*(int *)((long)pmVar9 + lVar31 + uVar32 * 4) << (bVar16 & 0x1f)) *
                       4.656613e-10;
                  *(float *)((long)pBufferOut + lVar31 * 2 + 4) =
                       (float)(iVar21 << (bVar17 & 0x1f)) * 4.656613e-10;
                  *(float *)((long)pBufferOut + lVar31 * 2 + 8) =
                       (float)(iVar15 << (bVar16 & 0x1f)) * 4.656613e-10;
                  *(float *)((long)pBufferOut + lVar31 * 2 + 0xc) =
                       (float)(iVar23 << (bVar17 & 0x1f)) * 4.656613e-10;
                  *(float *)((long)pBufferOut + lVar31 * 2 + 0x10) =
                       (float)(iVar20 << (bVar16 & 0x1f)) * 4.656613e-10;
                  *(float *)((long)pBufferOut + lVar31 * 2 + 0x14) =
                       (float)(iVar24 << (bVar17 & 0x1f)) * 4.656613e-10;
                  *(float *)((long)pBufferOut + lVar31 * 2 + 0x18) =
                       (float)(iVar26 << (bVar16 & 0x1f)) * 4.656613e-10;
                  *(float *)((long)pBufferOut + lVar31 * 2 + 0x1c) =
                       (float)(iVar30 << (bVar17 & 0x1f)) * 4.656613e-10;
                  lVar31 = lVar31 + 0x10;
                } while ((uVar28 >> 2) * 0x10 != lVar31);
              }
              uVar33 = (ulong)(uVar25 & 0xfffffffc);
              if (uVar33 != uVar28) {
                do {
                  pBufferOut[uVar33 * 2] =
                       (float)(pmVar9[uVar32 + uVar33] << (bVar16 & 0x1f)) * 4.656613e-10;
                  pBufferOut[uVar33 * 2 + 1] =
                       (float)(pmVar10[uVar32 + uVar33] << (bVar17 & 0x1f)) * 4.656613e-10;
                  uVar33 = uVar33 + 1;
                } while (uVar33 < uVar28);
              }
            }
            else {
              iVar15 = ((pFlac->currentFLACFrame).subframes[0].wastedBitsPerSample - uVar19) + 0x18;
              iVar20 = ((pFlac->currentFLACFrame).subframes[1].wastedBitsPerSample - uVar19) + 0x18;
              if (3 < uVar28) {
                lVar31 = 0;
                do {
                  piVar2 = (int *)((long)pmVar9 + lVar31 + uVar32 * 4);
                  iVar26 = piVar2[1];
                  iVar21 = piVar2[2];
                  iVar23 = piVar2[3];
                  piVar3 = (int *)((long)pmVar10 + lVar31 + uVar32 * 4);
                  iVar24 = *piVar3;
                  iVar30 = piVar3[1];
                  iVar34 = piVar3[2];
                  iVar44 = piVar3[3];
                  pfVar29 = (float *)((long)pBufferOut + lVar31 * 2);
                  *pfVar29 = (float)(*piVar2 << iVar15) * 1.1920929e-07;
                  pfVar29[1] = (float)(iVar24 << iVar20) * 1.1920929e-07;
                  pfVar29[2] = (float)iVar26 * 1.1920929e-07;
                  pfVar29[3] = (float)iVar30 * 1.1920929e-07;
                  auVar40._4_4_ = (float)iVar34 * 1.1920929e-07;
                  auVar40._0_4_ = (float)iVar21 * 1.1920929e-07;
                  auVar40._8_4_ = (float)iVar23 * 1.1920929e-07;
                  auVar40._12_4_ = (float)iVar44 * 1.1920929e-07;
                  *(undefined1 (*) [16])((long)pBufferOut + lVar31 * 2 + 0x10) = auVar40;
                  lVar31 = lVar31 + 0x10;
                } while ((uVar28 >> 2) * 0x10 != lVar31);
              }
              uVar33 = (ulong)(uVar25 & 0xfffffffc);
              if (uVar33 != uVar28) {
                do {
                  pBufferOut[uVar33 * 2] =
                       (float)(pmVar9[uVar32 + uVar33] << ((byte)iVar15 & 0x1f)) * 1.1920929e-07;
                  pBufferOut[uVar33 * 2 + 1] =
                       (float)(pmVar10[uVar32 + uVar33] << ((byte)iVar20 & 0x1f)) * 1.1920929e-07;
                  uVar33 = uVar33 + 1;
                } while (uVar33 < uVar28);
              }
            }
          }
          mVar35 = mVar35 + uVar28;
          pBufferOut = pBufferOut + bVar8 * uVar28;
          pFlac->currentPCMFrame = pFlac->currentPCMFrame + uVar28;
          framesToRead = framesToRead - uVar28;
          pmVar1 = &(pFlac->currentFLACFrame).pcmFramesRemaining;
          *pmVar1 = *pmVar1 - uVar25;
        }
      } while (framesToRead != 0);
      return mVar35;
    }
  }
  return 0;
}

Assistant:

MA_API ma_uint64 ma_dr_flac_read_pcm_frames_f32(ma_dr_flac* pFlac, ma_uint64 framesToRead, float* pBufferOut)
{
    ma_uint64 framesRead;
    ma_uint32 unusedBitsPerSample;
    if (pFlac == NULL || framesToRead == 0) {
        return 0;
    }
    if (pBufferOut == NULL) {
        return ma_dr_flac__seek_forward_by_pcm_frames(pFlac, framesToRead);
    }
    MA_DR_FLAC_ASSERT(pFlac->bitsPerSample <= 32);
    unusedBitsPerSample = 32 - pFlac->bitsPerSample;
    framesRead = 0;
    while (framesToRead > 0) {
        if (pFlac->currentFLACFrame.pcmFramesRemaining == 0) {
            if (!ma_dr_flac__read_and_decode_next_flac_frame(pFlac)) {
                break;
            }
        } else {
            unsigned int channelCount = ma_dr_flac__get_channel_count_from_channel_assignment(pFlac->currentFLACFrame.header.channelAssignment);
            ma_uint64 iFirstPCMFrame = pFlac->currentFLACFrame.header.blockSizeInPCMFrames - pFlac->currentFLACFrame.pcmFramesRemaining;
            ma_uint64 frameCountThisIteration = framesToRead;
            if (frameCountThisIteration > pFlac->currentFLACFrame.pcmFramesRemaining) {
                frameCountThisIteration = pFlac->currentFLACFrame.pcmFramesRemaining;
            }
            if (channelCount == 2) {
                const ma_int32* pDecodedSamples0 = pFlac->currentFLACFrame.subframes[0].pSamplesS32 + iFirstPCMFrame;
                const ma_int32* pDecodedSamples1 = pFlac->currentFLACFrame.subframes[1].pSamplesS32 + iFirstPCMFrame;
                switch (pFlac->currentFLACFrame.header.channelAssignment)
                {
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_LEFT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_left_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_RIGHT_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_right_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_MID_SIDE:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_mid_side(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                    case MA_DR_FLAC_CHANNEL_ASSIGNMENT_INDEPENDENT:
                    default:
                    {
                        ma_dr_flac_read_pcm_frames_f32__decode_independent_stereo(pFlac, frameCountThisIteration, unusedBitsPerSample, pDecodedSamples0, pDecodedSamples1, pBufferOut);
                    } break;
                }
            } else {
                ma_uint64 i;
                for (i = 0; i < frameCountThisIteration; ++i) {
                    unsigned int j;
                    for (j = 0; j < channelCount; ++j) {
                        ma_int32 sampleS32 = (ma_int32)((ma_uint32)(pFlac->currentFLACFrame.subframes[j].pSamplesS32[iFirstPCMFrame + i]) << (unusedBitsPerSample + pFlac->currentFLACFrame.subframes[j].wastedBitsPerSample));
                        pBufferOut[(i*channelCount)+j] = (float)(sampleS32 / 2147483648.0);
                    }
                }
            }
            framesRead                += frameCountThisIteration;
            pBufferOut                += frameCountThisIteration * channelCount;
            framesToRead              -= frameCountThisIteration;
            pFlac->currentPCMFrame    += frameCountThisIteration;
            pFlac->currentFLACFrame.pcmFramesRemaining -= (unsigned int)frameCountThisIteration;
        }
    }
    return framesRead;
}